

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int PostLoopFinalize(VP8EncIterator *it,int ok)

{
  long lVar1;
  uint in_ESI;
  long in_RDI;
  VP8EncIterator *unaff_retaddr;
  int s;
  int i;
  int p;
  VP8Encoder *enc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  local_14 = in_ESI;
  if (in_ESI != 0) {
    for (local_24 = 0; local_24 < *(int *)(lVar1 + 0x3c); local_24 = local_24 + 1) {
      VP8BitWriterFinish((VP8BitWriter *)0x16fd42);
      local_14 = ((*(int *)(lVar1 + (long)local_24 * 0x30 + 0x98) != 0 ^ 0xffU) & 1) & local_14;
    }
  }
  if (local_14 == 0) {
    VP8EncFreeBitWriters
              ((VP8Encoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_4 = WebPEncodingSetError(*(WebPPicture **)(lVar1 + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    if (*(long *)(*(long *)(lVar1 + 8) + 0x80) != 0) {
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          *(int *)(lVar1 + 0x5c04 + (long)local_28 * 0x10 + (long)iVar2 * 4) =
               (int)(*(long *)(in_RDI + 0xd0 + (long)iVar2 * 0x18 + (long)local_28 * 8) + 7U >> 3);
        }
      }
    }
    VP8AdjustFilterStrength(unaff_retaddr);
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static int PostLoopFinalize(VP8EncIterator* const it, int ok) {
  VP8Encoder* const enc = it->enc;
  if (ok) {      // Finalize the partitions, check for extra errors.
    int p;
    for (p = 0; p < enc->num_parts; ++p) {
      VP8BitWriterFinish(enc->parts + p);
      ok &= !enc->parts[p].error;
    }
  }

  if (ok) {      // All good. Finish up.
#if !defined(WEBP_DISABLE_STATS)
    if (enc->pic->stats != NULL) {  // finalize byte counters...
      int i, s;
      for (i = 0; i <= 2; ++i) {
        for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
          enc->residual_bytes[i][s] = (int)((it->bit_count[s][i] + 7) >> 3);
        }
      }
    }
#endif
    VP8AdjustFilterStrength(it);     // ...and store filter stats.
  } else {
    // Something bad happened -> need to do some memory cleanup.
    VP8EncFreeBitWriters(enc);
    return WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}